

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

uint Validator::constraintS1(Solution *solution)

{
  Turn *this;
  bool bVar1;
  int iVar2;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *this_00;
  reference __x;
  reference ppTVar3;
  vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> *this_01;
  size_type sVar4;
  Scenario *this_02;
  WeekData *this_03;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>_>
  *this_04;
  string *psVar5;
  mapped_type *this_05;
  ShiftType *this_06;
  mapped_type *this_07;
  const_reference ppDVar6;
  int optimal;
  unsigned_long nNurses;
  Turn *turn;
  iterator __end2;
  iterator __begin2;
  vector<Turn_*,_std::allocator<Turn_*>_> *__range2;
  vector<Turn_*,_std::allocator<Turn_*>_> day;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *__range1;
  uint sum;
  Solution *solution_local;
  
  __range1._4_4_ = 0;
  this_00 = Solution::getTurns(solution);
  __end1 = std::
           vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
           ::begin(this_00);
  day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>
                                *)&day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>
          ::operator*(&__end1);
    std::vector<Turn_*,_std::allocator<Turn_*>_>::vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2,__x);
    __end2 = std::vector<Turn_*,_std::allocator<Turn_*>_>::begin
                       ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2);
    turn = (Turn *)std::vector<Turn_*,_std::allocator<Turn_*>_>::end
                             ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                                  *)&turn);
      if (!bVar1) break;
      ppTVar3 = __gnu_cxx::__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                ::operator*(&__end2);
      this = *ppTVar3;
      this_01 = Turn::getNurses(this);
      sVar4 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::size(this_01);
      this_02 = Scenario::getInstance();
      this_03 = Scenario::getWeekData(this_02);
      this_04 = WeekData::getRequirements_abi_cxx11_(this_03);
      psVar5 = Turn::getSkill_abi_cxx11_(this);
      this_05 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>_>
                ::at(this_04,psVar5);
      this_06 = Turn::getShiftType(this);
      psVar5 = ShiftType::getId_abi_cxx11_(this_06);
      this_07 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>
                ::at(this_05,psVar5);
      iVar2 = Turn::getDay(this);
      ppDVar6 = std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>::at
                          (this_07,(long)iVar2);
      iVar2 = DayRequirement::getOptimalCoverage(*ppDVar6);
      if (sVar4 < (ulong)(long)iVar2) {
        __range1._4_4_ = __range1._4_4_ + (iVar2 - (int)sVar4) * 0x1e;
      }
      __gnu_cxx::__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
      operator++(&__end2);
    }
    std::vector<Turn_*,_std::allocator<Turn_*>_>::~vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2);
    __gnu_cxx::
    __normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

unsigned int Validator::constraintS1(const Solution &solution) {

    unsigned int sum = 0;

    for(vector<Turn *> day : solution.getTurns())
        for(Turn * turn : day){
            unsigned long nNurses = turn->getNurses().size();
            int optimal = Scenario::getInstance()->getWeekData().getRequirements().at(turn->getSkill()).at(turn->getShiftType()->getId()).at(
                    (unsigned long) turn->getDay())->getOptimalCoverage();
            if(nNurses < optimal)
                sum += 30 * (optimal - nNurses);
        }
    return sum;
}